

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rungame.c
# Opt level: O0

nh_bool get_gamedir(game_dirs dirtype,char *buf)

{
  __gid_t _Var1;
  __gid_t _Var2;
  __mode_t __mask;
  int iVar3;
  int *piVar4;
  char *pcVar5;
  char *basedir;
  char dirbuf [256];
  char *pcStack_28;
  mode_t mask;
  char *subdir;
  char *envval;
  char *buf_local;
  game_dirs dirtype_local;
  
  switch(dirtype) {
  case CONFIG_DIR:
    pcStack_28 = "";
    break;
  case SAVE_DIR:
    pcStack_28 = "save/";
    break;
  case LOG_DIR:
    pcStack_28 = "log/";
    break;
  case DUMP_DIR:
    pcStack_28 = "dumps/";
  }
  if (override_userdir != (char *)0x0) {
    _Var1 = getgid();
    _Var2 = getegid();
    if (_Var1 == _Var2) {
      snprintf(buf,0x100,"%s/%s",override_userdir,pcStack_28);
      goto LAB_0011da54;
    }
  }
  pcVar5 = getenv("XDG_CONFIG_HOME");
  if (pcVar5 == (char *)0x0) {
    pcVar5 = getenv("HOME");
    if (pcVar5 == (char *)0x0) {
      return '\0';
    }
    snprintf(buf,0x100,"%s/.config/DynaHack/%s",pcVar5,pcStack_28);
  }
  else {
    snprintf(buf,0x100,"%s/DynaHack/%s",pcVar5,pcStack_28);
  }
LAB_0011da54:
  __mask = umask(0);
  iVar3 = mkdir(buf,0x1ed);
  if ((iVar3 == -1) && (piVar4 = __errno_location(), *piVar4 != 0x11)) {
    strcpy((char *)&basedir,buf);
    pcVar5 = dirname((char *)&basedir);
    mkdir(pcVar5,0x1ed);
    iVar3 = mkdir(buf,0x1ed);
    if (iVar3 == -1) {
      umask(__mask);
      return '\0';
    }
  }
  umask(__mask);
  return '\x01';
}

Assistant:

nh_bool get_gamedir(enum game_dirs dirtype, char *buf)
{
    char *envval, *subdir;
    mode_t mask;

    switch (dirtype) {
	case CONFIG_DIR: subdir = ""; break;
	case SAVE_DIR:   subdir = "save/"; break;
	case LOG_DIR:    subdir = "log/"; break;
	case DUMP_DIR:   subdir = "dumps/"; break;
    }

    if (override_userdir && getgid() == getegid()) {
	snprintf(buf, BUFSZ, "%s/%s", override_userdir, subdir);
    } else {
	/* look in regular location */
	envval = getenv("XDG_CONFIG_HOME");
	if (envval) {
	    snprintf(buf, BUFSZ, "%s/DynaHack/%s", envval, subdir);
	} else {
	    envval = getenv("HOME");
	    if (!envval) /* HOME not set? just give up... */
		return FALSE;
	    snprintf(buf, BUFSZ, "%s/.config/DynaHack/%s", envval, subdir);
	}
    }

    mask = umask(0);
    if (mkdir(buf, 0755) == -1 && errno != EEXIST) {
	/* try to create the parent directory too. This is the only problem we
	 * can fix here - permission problems etc. all requre user intervention */
	char dirbuf[BUFSZ], *basedir;
	strcpy(dirbuf, buf);
	basedir = dirname(dirbuf);
	
	mkdir(basedir, 0755); /* no need to check the return value: if it doesn't work, we're screwed */
	if (mkdir(buf, 0755) == -1) {
	    umask(mask);
	    return FALSE;
	}
    }
    umask(mask);

    return TRUE;
}